

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::LayeredTexture::LayeredTexture
          (LayeredTexture *this,uint64_t id,Element *element,Document *param_3,string *name)

{
  BlendMode BVar1;
  Scope *this_00;
  Element *el;
  Element *el_00;
  Token *pTVar2;
  float fVar3;
  allocator<char> local_39;
  string local_38;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__LayeredTexture_008219c8;
  (this->textures).
  super__Vector_base<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->textures).
  super__Vector_base<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures).
  super__Vector_base<const_Assimp::FBX::Texture_*,_std::allocator<const_Assimp::FBX::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->blendMode = BlendMode_Modulate;
  this->alpha = 1.0;
  this_00 = GetRequiredScope(element);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"BlendModes",&local_39);
  el = Scope::operator[](this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Alphas",&local_39);
  el_00 = Scope::operator[](this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (el != (Element *)0x0) {
    pTVar2 = GetRequiredToken(el,0);
    BVar1 = ParseTokenAsInt(pTVar2);
    this->blendMode = BVar1;
  }
  if (el_00 != (Element *)0x0) {
    pTVar2 = GetRequiredToken(el_00,0);
    fVar3 = ParseTokenAsFloat(pTVar2);
    this->alpha = fVar3;
  }
  return;
}

Assistant:

LayeredTexture::LayeredTexture(uint64_t id, const Element& element, const Document& /*doc*/, const std::string& name)
: Object(id,element,name)
,blendMode(BlendMode_Modulate)
,alpha(1)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const BlendModes = sc["BlendModes"];
    const Element* const Alphas = sc["Alphas"];


    if(BlendModes!=0)
    {
        blendMode = (BlendMode)ParseTokenAsInt(GetRequiredToken(*BlendModes,0));
    }
    if(Alphas!=0)
    {
        alpha = ParseTokenAsFloat(GetRequiredToken(*Alphas,0));
    }
}